

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_sub2_i64_arm
               (TCGContext_conflict *tcg_ctx,TCGv_i64 rl,TCGv_i64 rh,TCGv_i64 al,TCGv_i64 ah,
               TCGv_i64 bl,TCGv_i64 bh)

{
  TCGv_i64 bl_local;
  TCGv_i64 ah_local;
  TCGv_i64 al_local;
  TCGv_i64 rh_local;
  TCGv_i64 rl_local;
  TCGContext_conflict *tcg_ctx_local;
  
  tcg_gen_op6_i64(tcg_ctx,INDEX_op_sub2_i64,rl,rh,al,ah,bl,bh);
  return;
}

Assistant:

void tcg_gen_sub2_i64(TCGContext *tcg_ctx, TCGv_i64 rl, TCGv_i64 rh, TCGv_i64 al,
                      TCGv_i64 ah, TCGv_i64 bl, TCGv_i64 bh)
{
#if TCG_TARGET_HAS_sub2_i64
        tcg_gen_op6_i64(tcg_ctx, INDEX_op_sub2_i64, rl, rh, al, ah, bl, bh);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_sub_i64(tcg_ctx, t0, al, bl);
        tcg_gen_setcond_i64(tcg_ctx, TCG_COND_LTU, t1, al, bl);
        tcg_gen_sub_i64(tcg_ctx, rh, ah, bh);
        tcg_gen_sub_i64(tcg_ctx, rh, rh, t1);
        tcg_gen_mov_i64(tcg_ctx, rl, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
        tcg_temp_free_i64(tcg_ctx, t1);
#endif
}